

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlChar * xmlXPathParseNCName(xmlXPathParserContextPtr ctxt)

{
  xmlChar xVar1;
  byte bVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  uint uVar5;
  long lVar6;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (pxVar4 = ctxt->cur, pxVar4 == (xmlChar *)0x0)) {
    return (xmlChar *)0x0;
  }
  xVar1 = *pxVar4;
  if (((byte)(xVar1 + 0x9f) < 0x1a) || (xVar1 == '_' || (byte)(xVar1 + 0xbf) < 0x1a)) {
    lVar6 = 1;
    do {
      bVar2 = pxVar4[lVar6];
      if ((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) {
        uVar5 = bVar2 - 0x20;
        if (0x3f < uVar5) break;
        if ((0x8000000000006000U >> ((ulong)uVar5 & 0x3f) & 1) == 0) goto LAB_001b8210;
      }
      lVar6 = lVar6 + 1;
    } while( true );
  }
LAB_001b824e:
  pxVar4 = xmlXPathParseNameComplex(ctxt,0);
  return pxVar4;
LAB_001b8210:
  if ((0x2800000144008401U >> ((ulong)uVar5 & 0x3f) & 1) != 0) {
    if ((int)lVar6 == 0) {
      return (xmlChar *)0x0;
    }
    pxVar3 = xmlStrndup(pxVar4,(int)lVar6);
    if (pxVar3 == (xmlChar *)0x0) {
      xmlXPathPErrMemory(ctxt);
    }
    ctxt->cur = pxVar4 + lVar6;
    return pxVar3;
  }
  goto LAB_001b824e;
}

Assistant:

xmlChar *
xmlXPathParseNCName(xmlXPathParserContextPtr ctxt) {
    const xmlChar *in;
    xmlChar *ret;
    int count = 0;

    if ((ctxt == NULL) || (ctxt->cur == NULL)) return(NULL);
    /*
     * Accelerator for simple ASCII names
     */
    in = ctxt->cur;
    if (((*in >= 0x61) && (*in <= 0x7A)) ||
	((*in >= 0x41) && (*in <= 0x5A)) ||
	(*in == '_')) {
	in++;
	while (((*in >= 0x61) && (*in <= 0x7A)) ||
	       ((*in >= 0x41) && (*in <= 0x5A)) ||
	       ((*in >= 0x30) && (*in <= 0x39)) ||
	       (*in == '_') || (*in == '.') ||
	       (*in == '-'))
	    in++;
	if ((*in == ' ') || (*in == '>') || (*in == '/') ||
            (*in == '[') || (*in == ']') || (*in == ':') ||
            (*in == '@') || (*in == '*')) {
	    count = in - ctxt->cur;
	    if (count == 0)
		return(NULL);
	    ret = xmlStrndup(ctxt->cur, count);
            if (ret == NULL)
                xmlXPathPErrMemory(ctxt);
	    ctxt->cur = in;
	    return(ret);
	}
    }
    return(xmlXPathParseNameComplex(ctxt, 0));
}